

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csharp_message.cc
# Opt level: O3

void __thiscall
google::protobuf::compiler::csharp::MessageGenerator::GenerateMessageSerializationMethods
          (MessageGenerator *this,Printer *printer)

{
  pointer ppFVar1;
  FieldGeneratorBase *pFVar2;
  Descriptor *pDVar3;
  ulong uVar4;
  long lVar5;
  long lVar6;
  
  SourceGeneratorBase::WriteGeneratedCodeAttributes(&this->super_SourceGeneratorBase,printer);
  io::Printer::Print(printer,"public void WriteTo(pb::CodedOutputStream output) {\n");
  io::Printer::Indent(printer);
  ppFVar1 = (this->fields_by_number_).
            super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if ((this->fields_by_number_).
      super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
      ._M_impl.super__Vector_impl_data._M_finish != ppFVar1) {
    uVar4 = 0;
    do {
      pFVar2 = CreateFieldGeneratorInternal(this,ppFVar1[uVar4]);
      if (pFVar2 == (FieldGeneratorBase *)0x0) goto LAB_0026847a;
      (*(pFVar2->super_SourceGeneratorBase)._vptr_SourceGeneratorBase[8])(pFVar2,printer);
      (*(pFVar2->super_SourceGeneratorBase)._vptr_SourceGeneratorBase[1])(pFVar2);
      uVar4 = uVar4 + 1;
      ppFVar1 = (this->fields_by_number_).
                super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                ._M_impl.super__Vector_impl_data._M_start;
    } while (uVar4 < (ulong)((long)(this->fields_by_number_).
                                   super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                                   ._M_impl.super__Vector_impl_data._M_finish - (long)ppFVar1 >> 3))
    ;
  }
  io::Printer::Outdent(printer);
  io::Printer::Print(printer,"}\n\n");
  SourceGeneratorBase::WriteGeneratedCodeAttributes(&this->super_SourceGeneratorBase,printer);
  io::Printer::Print(printer,"public int CalculateSize() {\n");
  io::Printer::Indent(printer);
  io::Printer::Print(printer,"int size = 0;\n");
  pDVar3 = this->descriptor_;
  if (0 < *(int *)(pDVar3 + 0x2c)) {
    lVar5 = 0;
    lVar6 = 0;
    do {
      pFVar2 = CreateFieldGeneratorInternal
                         (this,(FieldDescriptor *)(*(long *)(pDVar3 + 0x30) + lVar5));
      if (pFVar2 == (FieldGeneratorBase *)0x0) {
LAB_0026847a:
        __assert_fail("ptr_ != NULL",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/stubs/scoped_ptr.h"
                      ,0x5f,
                      "C *google::protobuf::internal::scoped_ptr<google::protobuf::compiler::csharp::FieldGeneratorBase>::operator->() const [C = google::protobuf::compiler::csharp::FieldGeneratorBase]"
                     );
      }
      (*(pFVar2->super_SourceGeneratorBase)._vptr_SourceGeneratorBase[9])(pFVar2,printer);
      (*(pFVar2->super_SourceGeneratorBase)._vptr_SourceGeneratorBase[1])(pFVar2);
      lVar6 = lVar6 + 1;
      pDVar3 = this->descriptor_;
      lVar5 = lVar5 + 0xa8;
    } while (lVar6 < *(int *)(pDVar3 + 0x2c));
  }
  io::Printer::Print(printer,"return size;\n");
  io::Printer::Outdent(printer);
  io::Printer::Print(printer,"}\n\n");
  return;
}

Assistant:

void MessageGenerator::GenerateMessageSerializationMethods(io::Printer* printer) {
  WriteGeneratedCodeAttributes(printer);
  printer->Print(
      "public void WriteTo(pb::CodedOutputStream output) {\n");
  printer->Indent();

  // Serialize all the fields
  for (int i = 0; i < fields_by_number().size(); i++) {
    scoped_ptr<FieldGeneratorBase> generator(
      CreateFieldGeneratorInternal(fields_by_number()[i]));
    generator->GenerateSerializationCode(printer);
  }

  // TODO(jonskeet): Memoize size of frozen messages?
  printer->Outdent();
  printer->Print(
	"}\n"
	"\n");
  WriteGeneratedCodeAttributes(printer);
  printer->Print(
    "public int CalculateSize() {\n");
  printer->Indent();
  printer->Print("int size = 0;\n");
  for (int i = 0; i < descriptor_->field_count(); i++) {
    scoped_ptr<FieldGeneratorBase> generator(
        CreateFieldGeneratorInternal(descriptor_->field(i)));
    generator->GenerateSerializedSizeCode(printer);
  }
  printer->Print("return size;\n");
  printer->Outdent();
  printer->Print("}\n\n");
}